

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void disas_move16_mem(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  uint uVar1;
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 ret;
  uint32_t uVar2;
  uint32_t uVar3;
  TCGv_i32 pTVar4;
  TCGv_i32 src;
  abi_ptr_conflict addr;
  TCGv_i32 *ppTVar5;
  TCGv_i32 dst;
  
  uVar1 = ((s->base).tb)->flags;
  tcg_ctx = s->uc->tcg_ctx;
  ppTVar5 = s->writeback;
  if (((uint)s->writeback_mask >> (insn & 7) & 1) == 0) {
    ppTVar5 = tcg_ctx->cpu_aregs;
  }
  ret = ppTVar5[insn & 7];
  uVar2 = cpu_lduw_code_m68k(env,s->pc);
  addr = s->pc + 2;
  s->pc = addr;
  uVar3 = cpu_lduw_code_m68k(env,addr);
  s->pc = s->pc + 2;
  pTVar4 = tcg_const_i32_m68k(tcg_ctx,uVar3 & 0xffff | uVar2 << 0x10);
  src = pTVar4;
  dst = ret;
  if ((insn & 8) == 0) {
    src = ret;
    dst = pTVar4;
  }
  m68k_copy_line(tcg_ctx,dst,src,(uint)((uVar1 >> 0xd & 1) == 0));
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(pTVar4 + (long)tcg_ctx));
  if ((insn & 0x10) != 0) {
    return;
  }
  tcg_gen_addi_i32_m68k(tcg_ctx,ret,ret,0x10);
  return;
}

Assistant:

DISAS_INSN(move16_mem)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int index = IS_USER(s);
    TCGv reg, addr;

    reg = AREG(insn, 0);
    addr = tcg_const_i32(tcg_ctx, read_im32(env, s));

    if ((insn >> 3) & 1) {
        /* MOVE16 (xxx).L, (Ay) */
        m68k_copy_line(tcg_ctx, reg, addr, index);
    } else {
        /* MOVE16 (Ay), (xxx).L */
        m68k_copy_line(tcg_ctx, addr, reg, index);
    }

    tcg_temp_free(tcg_ctx, addr);

    if (((insn >> 3) & 2) == 0) {
        /* (Ay)+ */
        tcg_gen_addi_i32(tcg_ctx, reg, reg, 16);
    }
}